

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O3

future<void> __thiscall
ThreadPool::enqueue<std::_Bind<void(*(int*))(int*)>>
          (ThreadPool *this,_Bind<void_(*(int_*))(int_*)> *f)

{
  runtime_error *this_00;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  future<void> fVar2;
  shared_ptr<std::packaged_task<void_()>_> task;
  unique_lock<std::mutex> lock;
  packaged_task<void_()> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  anon_class_16_1_8991e283 local_48;
  _Bind<std::_Bind<void_(*(int_*))(int_*)>_()> local_30;
  
  local_30._M_f._M_f = (_func_void_int_ptr *)*in_RDX;
  local_30._M_f._M_bound_args.super__Tuple_impl<0UL,_int_*>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_int_*>)in_RDX[1];
  local_58 = (packaged_task<void_()> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>,std::_Bind<std::_Bind<void(*(int*))(int*)>()>>
            (&_Stack_50,&local_58,(allocator<std::packaged_task<void_()>_> *)&local_48,&local_30);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)this);
  local_30._M_f._M_f = (_func_void_int_ptr *)&f[6]._M_bound_args;
  local_30._M_f._M_bound_args.super__Tuple_impl<0UL,_int_*>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_int_*>)
                 ((ulong)local_30._M_f._M_bound_args.super__Tuple_impl<0UL,_int_*>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl & 0xffffffffffffff00);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_30);
  local_30._M_f._M_bound_args.super__Tuple_impl<0UL,_int_*>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl._0_1_ = 1;
  if (*(char *)&f[0x11]._M_bound_args.super__Tuple_impl<0UL,_int_*>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl != '\x01') {
    local_48.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_58;
    local_48.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_50._M_pi;
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
      }
    }
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<ThreadPool::enqueue<std::_Bind<void(*(int*))(int*)>>(std::_Bind<void(*(int*))(int*)>&&)::_lambda()_1_>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &f[1]._M_bound_args,&local_48);
    if (local_48.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.task.
                 super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_30);
    std::condition_variable::notify_one();
    _Var1._M_pi = extraout_RDX;
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
      _Var1._M_pi = extraout_RDX_00;
    }
    fVar2.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var1._M_pi;
    fVar2.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<void>)
           fVar2.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"enqueue on stopped ThreadPool");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto ThreadPool::enqueue(F&& f, Args&&... args)
    -> std::future<typename std::result_of<F(Args...)>::type> {
  using return_type = typename std::result_of<F(Args...)>::type;
  auto task = std::make_shared< std::packaged_task<return_type()> >(
    std::bind(std::forward<F>(f), std::forward<Args>(args)...)
  );
  std::future<return_type> res = task->get_future();
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    // don't allow enqueueing after stopping the pool
    if (stop) {
      throw std::runtime_error("enqueue on stopped ThreadPool");
    }
    tasks.emplace([task](){ (*task)(); });
  }
  condition.notify_one();
  return res;
}